

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

void __thiscall re2::RE2::RE2(RE2 *this,char *pattern)

{
  StringPiece SStack_58;
  Options local_48;
  
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  (this->pattern_)._M_string_length = 0;
  (this->pattern_).field_2._M_local_buf[0] = '\0';
  Options::Options(&this->options_);
  (this->prefix_)._M_dataplus._M_p = (pointer)&(this->prefix_).field_2;
  (this->prefix_)._M_string_length = 0;
  (this->prefix_).field_2._M_local_buf[0] = '\0';
  (this->error_arg_)._M_dataplus._M_p = (pointer)&(this->error_arg_).field_2;
  (this->error_arg_)._M_string_length = 0;
  (this->error_arg_).field_2._M_local_buf[0] = '\0';
  this->rprog_once_ = 0;
  this->named_groups_once_ = 0;
  (this->group_names_once_)._M_once = 0;
  StringPiece::StringPiece(&SStack_58,pattern);
  local_48.encoding_ = EncodingUTF8;
  local_48.posix_syntax_ = false;
  local_48.longest_match_ = false;
  local_48.log_errors_ = true;
  local_48.max_mem_ = 0x800000;
  local_48.literal_ = false;
  local_48.never_nl_ = false;
  local_48.dot_nl_ = false;
  local_48.never_capture_ = false;
  local_48.case_sensitive_ = true;
  local_48.perl_classes_ = false;
  local_48.word_boundary_ = false;
  local_48.one_line_ = false;
  Init(this,&SStack_58,&local_48);
  return;
}

Assistant:

RE2::RE2(const char* pattern) {
  Init(pattern, DefaultOptions);
}